

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

bool __thiscall
wasm::ValidationInfo::shouldBeTrue<wasm::TupleMake*>
          (ValidationInfo *this,bool result,TupleMake *curr,char *text,Function *func)

{
  long *plVar1;
  size_type *psVar2;
  undefined7 in_register_00000031;
  long *local_78 [2];
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  if ((int)CONCAT71(in_register_00000031,result) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,text,&local_31);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0xbb132e);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_58.field_2._M_allocated_capacity = *psVar2;
      local_58.field_2._8_8_ = plVar1[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar2;
      local_58._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_58._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    fail<wasm::TupleMake*,std::__cxx11::string>(this,&local_58,curr,func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  return result;
}

Assistant:

bool shouldBeTrue(bool result,
                    T curr,
                    const char* text,
                    Function* func = nullptr) {
    if (!result) {
      fail("unexpected false: " + std::string(text), curr, func);
      return false;
    }
    return true;
  }